

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

void chacha20poly1305_init(ptls_aead_context_t *_ctx,void *iv,void *aad,size_t aadlen)

{
  _func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t **ctx;
  uint8_t tmpbuf [64];
  
  tmpbuf[0] = '\0';
  tmpbuf[1] = '\0';
  tmpbuf[2] = '\0';
  tmpbuf[3] = '\0';
  tmpbuf._4_8_ = *iv;
  tmpbuf._12_4_ = *(undefined4 *)((long)iv + 8);
  cf_chacha20_init_custom
            ((cf_chacha20_ctx *)&_ctx[1].do_encrypt_init,(uint8_t *)(_ctx + 1),0x20,tmpbuf,4);
  cf_chacha20_cipher((cf_chacha20_ctx *)&_ctx[1].do_encrypt_init,"",tmpbuf,0x40);
  ctx = &_ctx[3].do_encrypt_update;
  cf_poly1305_init((cf_poly1305 *)ctx,tmpbuf,tmpbuf + 0x10);
  (*ptls_clear_memory)(tmpbuf,0x40);
  if (aadlen != 0) {
    cf_poly1305_update((cf_poly1305 *)ctx,(uint8_t *)aad,aadlen);
    chacha20poly1305_encrypt_pad((cf_poly1305 *)ctx,aadlen);
  }
  _ctx[6].dispose_crypto = (_func_void_st_ptls_aead_context_t_ptr *)aadlen;
  _ctx[6].do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
  return;
}

Assistant:

static void chacha20poly1305_init(ptls_aead_context_t *_ctx, const void *iv, const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tmpbuf[64];

    /* init chacha */
    memset(tmpbuf, 0, 16 - PTLS_CHACHA20POLY1305_IV_SIZE);
    memcpy(tmpbuf + 16 - PTLS_CHACHA20POLY1305_IV_SIZE, iv, PTLS_CHACHA20POLY1305_IV_SIZE);
    cf_chacha20_init_custom(&ctx->chacha, ctx->key, sizeof(ctx->key), tmpbuf, 4);

    /* init poly1305 (by using first 16 bytes of the key stream of the first block) */
    cf_chacha20_cipher(&ctx->chacha, zeros64, tmpbuf, 64);
    cf_poly1305_init(&ctx->poly, tmpbuf, tmpbuf + 16);

    ptls_clear_memory(tmpbuf, sizeof(tmpbuf));

    /* aad */
    if (aadlen != 0) {
        cf_poly1305_update(&ctx->poly, aad, aadlen);
        chacha20poly1305_encrypt_pad(&ctx->poly, aadlen);
    }

    ctx->aadlen = aadlen;
    ctx->textlen = 0;
}